

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t *
Acb_FindSupportMinOne
          (sat_solver *pSat,int iFirstDiv,Vec_Wrd_t *vPats,int *pnPats,Vec_Int_t *vSupp,int iVar)

{
  int iVar1;
  lit *begin;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  iVar1 = vPats->nSize;
  iVar2 = iVar1 + 0xff;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  iVar3 = vSupp->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  p->nSize = 0;
  p->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  p->pArray = piVar4;
  if (0 < vSupp->nSize) {
    uVar7 = 0;
    do {
      if ((uint)iVar != uVar7) {
        Vec_IntPush(p,vSupp->pArray[uVar7]);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)vSupp->nSize);
  }
  begin = p->pArray;
  iVar3 = sat_solver_solve(pSat,begin,begin + p->nSize,0,0,0,0);
  if (iVar3 != -1) {
    if (begin != (lit *)0x0) {
      free(begin);
      p->pArray = (int *)0x0;
    }
    free(p);
    if (iVar3 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,0x40b,
                    "Vec_Int_t *Acb_FindSupportMinOne(sat_solver *, int, Vec_Wrd_t *, int *, Vec_Int_t *, int)"
                   );
    }
    if (0xff < iVar1) {
      uVar7 = (ulong)(uint)iFirstDiv;
      uVar6 = (ulong)(uint)(iVar2 >> 8);
      lVar8 = 0;
      do {
        if ((iFirstDiv < 0) || (pSat->size <= (int)uVar7)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (pSat->model[uVar7] == 1) {
          if (vPats->nSize <= lVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          vPats->pArray[(*pnPats >> 6) + lVar8] =
               vPats->pArray[(*pnPats >> 6) + lVar8] | 1L << ((byte)*pnPats & 0x3f);
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x100;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
    iVar1 = *pnPats;
    *pnPats = iVar1 + 1;
    p = vSupp;
    if (iVar1 + 1 == 0x4000) {
      p = (Vec_Int_t *)0x0;
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Acb_FindSupportMinOne( sat_solver * pSat, int iFirstDiv, Vec_Wrd_t * vPats, int * pnPats, Vec_Int_t * vSupp, int iVar )
{
    int i, iLit, status;
    int nDivs = Vec_WrdSize(vPats)/NWORDS;
    Vec_Int_t * vLits = Vec_IntAlloc( Vec_IntSize(vSupp) );
    Vec_IntForEachEntry( vSupp, iLit, i )
        if ( i != iVar )
            Vec_IntPush( vLits, iLit );
    // try one run
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
    if ( status == l_False )
        return vLits;
    Vec_IntFree( vLits );
    assert( status == l_True );
    // collect pattern
    for ( i = 0; i < nDivs; i++ )
    {
        if ( sat_solver_var_value(pSat, iFirstDiv+i) == 0 )
            continue;
        Abc_TtSetBit( Vec_WrdEntryP(vPats, NWORDS*i), *pnPats );
    }
    (*pnPats)++;
    if ( *pnPats == NWORDS*64 )
        return NULL;
    return vSupp;
}